

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h:9775:41)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olivermichel[P]libom2_test_include_catch_h:9775:41)>
          *this,string *arg)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  When WVar4;
  string keypressLc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_c0);
  WVar4 = Never;
  local_78 = 0;
  local_80 = &PTR__BasicResult_001ae118;
  local_68 = 0;
  local_60[0] = 0;
  local_70 = local_60;
  toLower(&local_e0,&local_c0);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_e0);
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_e0);
    if (iVar1 == 0) {
      WVar4 = BeforeStart;
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_e0);
      if (iVar1 == 0) {
        WVar4 = BeforeExit;
      }
      else {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_e0);
        if (iVar1 != 0) {
          ::std::operator+(&local_50,
                           "keypress argument must be one of: never, start, exit or both. \'",
                           &local_c0);
          plVar2 = (long *)::std::__cxx11::string::append((char *)&local_50);
          psVar3 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar3) {
            local_a0.field_2._M_allocated_capacity = *psVar3;
            local_a0.field_2._8_8_ = plVar2[3];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          }
          else {
            local_a0.field_2._M_allocated_capacity = *psVar3;
            local_a0._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_a0._M_string_length = plVar2[1];
          *plVar2 = (long)psVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                    (__return_storage_ptr__,RuntimeError,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          goto LAB_0013591c;
        }
        WVar4 = BeforeStartAndExit;
      }
    }
  }
  ((this->m_lambda).config)->waitForKeypress = WVar4;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001ae118;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0013591c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_80 = &PTR__BasicResult_001ae118;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }